

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprs.cpp
# Opt level: O3

CTcSymObj * __thiscall CTcParser::add_gen_obj(CTcParser *this,char *clsname)

{
  int iVar1;
  size_t sVar2;
  undefined4 extraout_var;
  CTcSymObj *pCVar3;
  CTcPrsSymtab *curtab;
  CTcPrsSymtab *pCVar4;
  
  pCVar4 = this->global_symtab_;
  sVar2 = strlen(clsname);
  do {
    iVar1 = (*pCVar4->_vptr_CTcPrsSymtab[2])(pCVar4,clsname,sVar2);
    pCVar3 = (CTcSymObj *)CONCAT44(extraout_var,iVar1);
    if (pCVar3 != (CTcSymObj *)0x0) {
      (*(pCVar3->super_CTcSymObjBase).super_CTcSymbol.super_CTcSymbolBase.super_CVmHashEntryCS.
        super_CVmHashEntry._vptr_CVmHashEntry[0xf])(pCVar3);
      if (*(int *)&(pCVar3->super_CTcSymObjBase).super_CTcSymbol.super_CTcSymbolBase.
                   super_CVmHashEntryCS.super_CVmHashEntry.field_0x24 != 2) {
        return (CTcSymObj *)0x0;
      }
      pCVar3 = add_gen_obj(this,pCVar3);
      return pCVar3;
    }
    pCVar4 = pCVar4->parent_;
  } while (pCVar4 != (CTcPrsSymtab *)0x0);
  return (CTcSymObj *)0x0;
}

Assistant:

CTcSymObj *CTcParser::add_gen_obj(const char *clsname)
{
    /* look up the class symbol */
    CTcSymObj *cls = (CTcSymObj *)global_symtab_->find(
        clsname, strlen(clsname));

    /* make sure we found an object symbol */
    if (cls != 0 && cls->get_type() == TC_SYM_OBJ)
    {
        /* got it - go create the object */
        return add_gen_obj(cls);
    }
    else
    {
        /* not an object - return failure */
        return 0;
    }
}